

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.h
# Opt level: O2

int ChebTools::get_increasingleftofval<Eigen::Matrix<double,_1,1,0,_1,1>>
              (Matrix<double,__1,_1,_0,__1,_1> *breakpoints,double x,int N)

{
  CoeffReturnType pdVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  iVar2 = N + -1;
  iVar4 = 0;
  while (iVar3 = iVar4, 1 < iVar2 - iVar3) {
    iVar4 = (int)((ulong)((long)iVar3 + (long)iVar2) >> 1);
    pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)breakpoints,
                        (long)iVar3 + (long)iVar2 >> 1);
    if (x < *pdVar1) {
      iVar2 = iVar4;
      iVar4 = iVar3;
    }
  }
  return iVar3;
}

Assistant:

int get_increasingleftofval(const VecType& breakpoints, double x, int N) {
        int iL = 0, iR = N - 1, iM;
        while (iR - iL > 1) {
            iM = midpoint_Knuth(iL, iR);
            if (x >= breakpoints[iM]) {
                iL = iM;
            }
            else {
                iR = iM;
            }
        }
        return iL;
    }